

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O1

int fsync_failure_cb(void *ctx,filemgr_ops *normal_ops,int fd)

{
  int iVar1;
  int *piVar2;
  fail_ctx_t *wctx;
  
  iVar1 = *(int *)((long)ctx + 4);
  *(int *)((long)ctx + 4) = iVar1 + 1;
  if (iVar1 < *(int *)((long)ctx + 8)) {
    iVar1 = (*normal_ops->fsync)(fd);
    return iVar1;
  }
  *(int *)ctx = *ctx + 1;
  piVar2 = __errno_location();
  *piVar2 = -2;
  return -0xe;
}

Assistant:

int fsync_failure_cb(void *ctx, struct filemgr_ops *normal_ops,
                     int fd) {
    fail_ctx_t *wctx = (fail_ctx_t *)ctx;
    wctx->num_ops++;
    if (wctx->num_ops > wctx->start_failing_after) {
        wctx->num_fails++;
        errno = -2;
        return (ssize_t)FDB_RESULT_FSYNC_FAIL;
    }

    return normal_ops->fsync(fd);
}